

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall cppcms::json::value::copyable::copyable(copyable *this,copyable *r)

{
  _data *p_Var1;
  _data *p_Var2;
  
  p_Var2 = (_data *)operator_new(0x38);
  (p_Var2->value_).m.p = (void *)0x0;
  *(undefined8 *)((long)&(p_Var2->value_).m + 8) = 0;
  *(undefined8 *)((long)&(p_Var2->value_).m + 0x10) = 0;
  *(undefined8 *)((long)&(p_Var2->value_).m + 0x18) = 0;
  *(undefined8 *)((long)&(p_Var2->value_).m + 0x20) = 0;
  *(undefined8 *)((long)&(p_Var2->value_).m + 0x28) = 0;
  *(undefined8 *)&(p_Var2->value_).type = 0;
  (this->d).ptr_ = p_Var2;
  p_Var1 = (r->d).ptr_;
  (r->d).ptr_ = p_Var2;
  (this->d).ptr_ = p_Var1;
  return;
}

Assistant:

value::copyable::copyable(value::copyable &&r) : d(new value::_data())
	{
		d.swap(r.d);
	}